

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

text * lest::of_type(text *__return_storage_ptr__,text *type)

{
  text *type_local;
  
  std::operator+(__return_storage_ptr__,"of type ",type);
  return __return_storage_ptr__;
}

Assistant:

inline text of_type( text type )
{
    return "of type " + type;
}